

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotree.hpp
# Opt level: O3

void __thiscall
ImputedData<unsigned_long,long_double>::ImputedData<InputData<double,unsigned_long>>
          (ImputedData<unsigned_long,long_double> *this,InputData<double,_unsigned_long> *input_data
          ,size_t row)

{
  memset(this,0,0xd8);
  initialize_impute_calc<ImputedData<unsigned_long,long_double>,InputData<double,unsigned_long>>
            ((ImputedData<unsigned_long,_long_double> *)this,input_data,row);
  return;
}

Assistant:

ImputedData(InputData &input_data, size_t row)
    {
        initialize_impute_calc(*this, input_data, row);
    }